

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

FastString MQTTStringPrintf(char *format,...)

{
  uint len;
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar2;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  FastString FVar3;
  va_list argp;
  char buf [512];
  undefined8 local_2d8;
  void **local_2d0;
  undefined1 *local_2c8;
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 local_218;
  char local_208 [512];
  
  local_2c8 = local_2b8;
  if (in_AL != '\0') {
    local_288 = in_XMM0_Qa;
    local_278 = in_XMM1_Qa;
    local_268 = in_XMM2_Qa;
    local_258 = in_XMM3_Qa;
    local_248 = in_XMM4_Qa;
    local_238 = in_XMM5_Qa;
    local_228 = in_XMM6_Qa;
    local_218 = in_XMM7_Qa;
  }
  local_2d0 = &argp[0].overflow_arg_area;
  local_2d8 = 0x3000000010;
  local_2a8 = in_RDX;
  local_2a0 = in_RCX;
  local_298 = in_R8;
  local_290 = in_R9;
  uVar1 = vsnprintf(local_208,0x200,in_RSI,&local_2d8);
  if ((int)uVar1 < 1) {
    Bstrlib::String::String((String *)format);
    puVar2 = extraout_RDX_00;
  }
  else {
    len = 0x1ff;
    if (uVar1 < 0x1ff) {
      len = uVar1;
    }
    local_208[len] = '\0';
    Bstrlib::String::String((String *)format,local_208,len);
    puVar2 = extraout_RDX;
  }
  FVar3.super_tagbstring.data = puVar2;
  FVar3.super_tagbstring._0_8_ = format;
  return (FastString)FVar3.super_tagbstring;
}

Assistant:

static MQTTString MQTTStringPrintf(const char * format, ...)
      {
          va_list argp;
          va_start(argp, format);
          char buf[512];
          // We use vasprintf extension to avoid dual parsing of the format string to find out the required length
          int err = vsnprintf(buf, sizeof(buf), format, argp);
          va_end(argp);
          if (err <= 0) return MQTTString();
          if (err >= (int)sizeof(buf)) err = (int)(sizeof(buf) - 1);
          buf[err] = 0;
          return MQTTString(buf, (size_t)err);
      }